

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_hexlineedit.cpp
# Opt level: O1

int __thiscall HexLineEdit::qt_metacall(HexLineEdit *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined4 in_register_00000014;
  HexLineEdit *_t;
  
  iVar1 = QLineEdit::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (-1 < iVar1) {
    switch(_c) {
    case ReadProperty:
      if (iVar1 == 0) {
        *(bool *)*_a = this->m_editAsGuid;
      }
      break;
    case WriteProperty:
      if (iVar1 == 0) {
        this->m_editAsGuid = **_a;
      }
      break;
    case ResetProperty:
    case RegisterPropertyMetaType:
    case BindableProperty:
      break;
    default:
      goto switchD_0012467e_caseD_4;
    }
    iVar1 = iVar1 + -1;
  }
switchD_0012467e_caseD_4:
  return iVar1;
}

Assistant:

int HexLineEdit::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QLineEdit::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    
#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}